

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger_p.h
# Opt level: O0

bool __thiscall QTestCharBuffer::reset(QTestCharBuffer *this,int newSize,bool copy)

{
  byte in_DL;
  int in_ESI;
  int *in_RDI;
  char *newBuf;
  char *local_20;
  
  if (*(int **)(in_RDI + 2) == in_RDI + 4) {
    local_20 = (char *)malloc((long)in_ESI);
    if (((in_DL & 1) != 0) && (local_20 != (char *)0x0)) {
      qstrncpy(local_20,*(char **)(in_RDI + 2),(long)*in_RDI);
    }
  }
  else {
    local_20 = (char *)realloc(*(void **)(in_RDI + 2),(long)in_ESI);
  }
  if (local_20 != (char *)0x0) {
    *in_RDI = in_ESI;
    *(char **)(in_RDI + 2) = local_20;
  }
  return local_20 != (char *)0x0;
}

Assistant:

bool reset(int newSize, bool copy = false)
    {
        char *newBuf = nullptr;
        if (buf == staticBuf) {
            // if we point to our internal buffer, we need to malloc first
            newBuf = reinterpret_cast<char *>(malloc(newSize));
            if (copy && newBuf)
                qstrncpy(newBuf, buf, _size);
        } else {
            // if we already malloc'ed, just realloc
            newBuf = reinterpret_cast<char *>(realloc(buf, newSize));
        }

        // if the allocation went wrong (newBuf == 0), we leave the object as is
        if (!newBuf)
            return false;

        _size = newSize;
        buf = newBuf;
        return true;
    }